

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O2

void remora::bindings::mgemm<float,float,remora::bindings::gemm_block_size<float>>
               (float alpha,ulong mc,ulong nc,size_t kc,long A,long B,float *C,size_t stride1,
               size_t stride2)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *B_00;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  float CTempBlock [64];
  
  uVar4 = 0;
  uVar8 = nc;
  pfVar10 = C;
  while( true ) {
    uVar6 = 0x10;
    if (uVar8 < 0x10) {
      uVar6 = uVar8;
    }
    if (uVar4 == nc + 0xf >> 4) break;
    B_00 = (float *)(kc * 0x40 * uVar4 + B);
    uVar13 = 0;
    pfVar11 = pfVar10;
    uVar12 = mc;
    while( true ) {
      uVar14 = 4;
      if (uVar12 < 4) {
        uVar14 = uVar12;
      }
      if (uVar13 == mc + 3 >> 2) break;
      if (mc + uVar13 * -4 < 4 || nc + uVar4 * -0x10 < 0x10) {
        for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 4) {
          *(undefined4 *)((long)CTempBlock + lVar1) = 0;
        }
        ugemm<remora::bindings::gemm_block_size<float>,float,float>
                  (kc,alpha,(float *)(kc * 0x10 * uVar13 + A),B_00,CTempBlock,0x10,1);
        pfVar3 = CTempBlock;
        pfVar2 = pfVar11;
        for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
          pfVar7 = pfVar2;
          for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
            *pfVar7 = pfVar3[uVar9] + *pfVar7;
            pfVar7 = pfVar7 + stride2;
          }
          pfVar3 = pfVar3 + 0x10;
          pfVar2 = pfVar2 + stride1;
        }
      }
      else {
        ugemm<remora::bindings::gemm_block_size<float>,float,float>
                  (kc,alpha,(float *)(kc * 0x10 * uVar13 + A),B_00,
                   C + uVar4 * 0x10 * stride2 + uVar13 * 4 * stride1,stride1,stride2);
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 - 4;
      pfVar11 = pfVar11 + stride1 * 4;
    }
    uVar4 = uVar4 + 1;
    uVar8 = uVar8 - 0x10;
    pfVar10 = pfVar10 + stride2 * 0x10;
  }
  return;
}

Assistant:

void mgemm(
	std::size_t mc, std::size_t nc, std::size_t kc, TC alpha,
	T const* A, T const* B, TC *C,
	std::size_t stride1, std::size_t stride2, block_size
){
	static std::size_t const MR = block_size::mr;
	static std::size_t const NR = block_size::nr;
	std::size_t const mp  = (mc+MR-1) / MR;
	std::size_t const np  = (nc+NR-1) / NR;

	for (std::size_t j=0; j<np; ++j) {
		std::size_t const nr = std::min(NR, nc - j*NR);

		for (std::size_t i=0; i<mp; ++i) {
			std::size_t const mr = std::min(MR, mc - i*MR);
			auto CBlockStart = C+i*MR*stride1+j*NR*stride2;
			if (mr==MR && nr==NR) {
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CBlockStart, stride1, stride2
				);
			} else {
				TC CTempBlock[MR*NR];
				std::fill_n(CTempBlock, MR*NR, T(0));
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CTempBlock, NR, 1
				);

				for (std::size_t i0=0; i0<mr; ++i0){
					for (std::size_t j0=0; j0<nr; ++j0) {
						CBlockStart[i0*stride1+j0 * stride2] += CTempBlock[i0*NR+j0];
					}
				}
			}
		}
	}
}